

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explorer.hpp
# Opt level: O0

vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *
explorer::LoadFromFile<uttt::IBoard,uttt::IBoardReader,24>(string *filename)

{
  byte bVar1;
  ostream *poVar2;
  reference pvVar3;
  ostream *poVar4;
  string *in_RSI;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_RDI;
  rep millis;
  time_point t2;
  vector<char,_std::allocator<char>_> bytes;
  time_point t1;
  longlong total_bytes;
  int i;
  char count_buf [8];
  longlong count;
  ifstream file;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *data;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffc28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffc30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffc38;
  allocator_type *in_stack_fffffffffffffc40;
  size_type in_stack_fffffffffffffc48;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  duration<long,_std::ratio<1L,_1000L>_> local_2b0;
  undefined8 local_2a8;
  undefined1 local_299;
  undefined8 local_298;
  rep local_290;
  duration<long,_std::ratio<1L,_1000L>_> local_288;
  rep local_280;
  undefined8 local_278;
  allocator<char> local_269;
  vector<char,_std::allocator<char>_> local_268;
  undefined8 local_250;
  long local_248;
  int local_23c;
  byte local_238 [8];
  ulong local_230;
  undefined4 local_228;
  char local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  std::ifstream::ifstream(local_218,in_RSI,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    memset(in_RDI,0,0x18);
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)0x1f4134);
    local_228 = 1;
  }
  else {
    local_230 = 0;
    std::istream::read(local_218,(long)local_238);
    for (local_23c = 0; local_23c < 8; local_23c = local_23c + 1) {
      local_230 = local_230 << 8 | (ulong)local_238[local_23c];
    }
    local_248 = local_230 * 0x18 + 8;
    poVar2 = std::operator<<((ostream *)&std::cout,"Reading ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_230);
    poVar2 = std::operator<<(poVar2," nodes from ");
    poVar2 = std::operator<<(poVar2,local_10);
    std::operator<<(poVar2,'\n');
    local_250 = std::chrono::_V2::system_clock::now();
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::allocator<char>::~allocator(&local_269);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_268,0);
    std::vector<char,_std::allocator<char>_>::size(&local_268);
    std::istream::read(local_218,(long)pvVar3);
    local_278 = std::chrono::_V2::system_clock::now();
    local_290 = (rep)std::chrono::operator-(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    local_288.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (in_stack_fffffffffffffc28);
    local_280 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_288);
    poVar2 = std::operator<<((ostream *)&std::cout,"Reading done: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_248);
    poVar2 = std::operator<<(poVar2," bytes in ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_280 / 1000);
    poVar2 = std::operator<<(poVar2,"s ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_280 % 1000);
    poVar2 = std::operator<<(poVar2,"ms, ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)local_248 * 0.0009765625 * 1000.0 * 0.0009765625) /
                               (double)local_280);
    std::operator<<(poVar2," MB/s\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"Serializing ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar2,local_230);
    std::operator<<(poVar4," nodes...\n");
    local_298 = std::chrono::_V2::system_clock::now();
    local_299 = 0;
    local_250 = local_298;
    uttt::IBoardReader::operator()
              ((IBoardReader *)poVar2,(vector<char,_std::allocator<char>_> *)poVar4);
    local_2a8 = std::chrono::_V2::system_clock::now();
    local_278 = local_2a8;
    std::chrono::operator-(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    local_2b0.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (in_stack_fffffffffffffc28);
    local_280 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_2b0);
    poVar2 = std::operator<<((ostream *)&std::cout,"Serialization done: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_230);
    poVar2 = std::operator<<(poVar2," nodes in ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_280 / 1000);
    poVar2 = std::operator<<(poVar2,"s ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_280 % 1000);
    poVar2 = std::operator<<(poVar2,"ms, ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((double)(long)local_230 * 1000.0) / (double)local_280)
    ;
    poVar4 = std::operator<<(poVar2," nps, ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,((double)local_248 * 0.0009765625 * 1000.0 * 0.0009765625) /
                               (double)local_280);
    std::operator<<(poVar4," MB/s\n");
    local_228 = 1;
    local_299 = 1;
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)poVar2)
    ;
  }
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

static std::vector<IGame>
LoadFromFile(const std::string &filename)
{
    std::ifstream file(filename, std::ios::binary);
    if (!file.good())
        return {};

    long long count = 0;
    char count_buf[8];

    file.read(count_buf, 8);
    for (int i = 0; i < 8; ++i)
        count = (count << 8) | uint8_t(count_buf[i]);

    long long total_bytes = 8 + count * Size;

    std::cout << "Reading " << count << " nodes from " << filename << '\n';
    auto t1 = std::chrono::high_resolution_clock::now();
    std::vector<char> bytes(count * Size);
    file.read(&bytes[0], bytes.size());
    auto t2 = std::chrono::high_resolution_clock::now();
    auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Reading done: " << total_bytes << " bytes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(total_bytes) / 1024 * 1000 / 1024 / millis << " MB/s\n";

    std::cout << "Serializing " << count << " nodes...\n";
    t1 = std::chrono::high_resolution_clock::now();
    auto data = Reader()(bytes);
    t2 = std::chrono::high_resolution_clock::now();
    millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Serialization done: " << count << " nodes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(count) * 1000 / millis << " nps, " << double(total_bytes) / 1024 * 1000 / 1024 / millis << " MB/s\n";

    return data;
}